

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QMdi::Rearranger*>::emplace<QMdi::Rearranger*&>
          (QPodArrayOps<QMdi::Rearranger_*> *this,qsizetype i,Rearranger **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  Rearranger **ppRVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QMdi::Rearranger_*> *in_RDI;
  Rearranger **where;
  GrowthPosition pos;
  Rearranger *tmp;
  bool detach;
  QArrayDataPointer<QMdi::Rearranger_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  Rearranger *pRVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<QMdi::Rearranger_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QMdi::Rearranger_*>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppRVar3 = QArrayDataPointer<QMdi::Rearranger_*>::end(in_RDI);
      *ppRVar3 = (Rearranger *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QMdi::Rearranger_*>::freeSpaceAtBegin(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppRVar3 = QArrayDataPointer<QMdi::Rearranger_*>::begin
                          ((QArrayDataPointer<QMdi::Rearranger_*> *)0x625ef7);
      ppRVar3[-1] = (Rearranger *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pRVar5 = (Rearranger *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<QMdi::Rearranger_*>::detachAndGrow
            ((QArrayDataPointer<QMdi::Rearranger_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)pRVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (Rearranger ***)in_stack_ffffffffffffffc8,in_RDI);
  ppRVar3 = QPodArrayOps<QMdi::Rearranger_*>::createHole
                      ((QPodArrayOps<QMdi::Rearranger_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0)
                       ,(GrowthPosition)((ulong)pRVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppRVar3 = pRVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }